

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FloatValue::ByteSizeLong(FloatValue *this)

{
  uint uVar1;
  uint32_t *puVar2;
  size_t sVar3;
  float local_28;
  uint local_24;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  FloatValue *this_;
  FloatValue *this_local;
  
  sStack_20 = 0;
  local_24 = 0;
  total_size = (size_t)this;
  this_ = this;
  puVar2 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_24 = *puVar2;
  if ((local_24 & 1) != 0) {
    local_28 = _internal_value((FloatValue *)total_size);
    uVar1 = absl::lts_20250127::bit_cast<unsigned_int,_float,_0>(&local_28);
    if (uVar1 != 0) {
      sStack_20 = sStack_20 + 5;
    }
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    ((Message *)total_size,sStack_20,(CachedSize *)(total_size + 0x14));
  return sVar3;
}

Assistant:

::size_t FloatValue::ByteSizeLong() const {
  const FloatValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FloatValue)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // float value = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (::absl::bit_cast<::uint32_t>(this_._internal_value()) != 0) {
        total_size += 5;
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}